

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

void anon_unknown.dwarf_49742::WriteAttribute(FILE *fp,char *name,char *type,uchar *data,int len)

{
  uchar *__ptr;
  bool bVar1;
  size_t sVar2;
  size_t sVar3;
  uint local_3c;
  size_t sStack_38;
  int outLen;
  size_t n;
  uchar *puStack_28;
  int len_local;
  uchar *data_local;
  char *type_local;
  char *name_local;
  FILE *fp_local;
  
  n._4_4_ = len;
  puStack_28 = data;
  data_local = (uchar *)type;
  type_local = name;
  name_local = (char *)fp;
  sVar2 = strlen(name);
  sVar2 = fwrite(name,1,sVar2 + 1,(FILE *)name_local);
  sStack_38 = sVar2;
  sVar3 = strlen(type_local);
  __ptr = data_local;
  if (sVar2 != sVar3 + 1) {
    __assert_fail("n == strlen(name) + 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cyang2020[P]Rasterizer/CGL/include/CGL/tinyexr.h"
                  ,0x1b1a,
                  "void (anonymous namespace)::WriteAttribute(FILE *, const char *, const char *, const unsigned char *, int)"
                 );
  }
  sVar2 = strlen((char *)data_local);
  sVar2 = fwrite(__ptr,1,sVar2 + 1,(FILE *)name_local);
  sStack_38 = sVar2;
  sVar3 = strlen((char *)data_local);
  if (sVar2 != sVar3 + 1) {
    __assert_fail("n == strlen(type) + 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cyang2020[P]Rasterizer/CGL/include/CGL/tinyexr.h"
                  ,0x1b1d,
                  "void (anonymous namespace)::WriteAttribute(FILE *, const char *, const char *, const unsigned char *, int)"
                 );
  }
  local_3c = n._4_4_;
  bVar1 = IsBigEndian();
  if (bVar1) {
    swap4(&local_3c);
  }
  sStack_38 = fwrite(&local_3c,1,4,(FILE *)name_local);
  if (sStack_38 != 4) {
    __assert_fail("n == sizeof(int)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cyang2020[P]Rasterizer/CGL/include/CGL/tinyexr.h"
                  ,0x1b24,
                  "void (anonymous namespace)::WriteAttribute(FILE *, const char *, const char *, const unsigned char *, int)"
                 );
  }
  sStack_38 = fwrite(puStack_28,1,(long)(int)n._4_4_,(FILE *)name_local);
  if (sStack_38 != (long)(int)n._4_4_) {
    __assert_fail("n == (size_t)len",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cyang2020[P]Rasterizer/CGL/include/CGL/tinyexr.h"
                  ,0x1b27,
                  "void (anonymous namespace)::WriteAttribute(FILE *, const char *, const char *, const unsigned char *, int)"
                 );
  }
  return;
}

Assistant:

void WriteAttribute(FILE *fp, const char *name, const char *type,
                    const unsigned char *data, int len) {
  size_t n = fwrite(name, 1, strlen(name) + 1, fp);
  assert(n == strlen(name) + 1);

  n = fwrite(type, 1, strlen(type) + 1, fp);
  assert(n == strlen(type) + 1);

  int outLen = len;
  if (IsBigEndian()) {
    swap4(reinterpret_cast<unsigned int *>(&outLen));
  }
  n = fwrite(&outLen, 1, sizeof(int), fp);
  assert(n == sizeof(int));

  n = fwrite(data, 1, len, fp);
  assert(n == (size_t)len);

  (void)n;
}